

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::GridDataType0::Decode(GridDataType0 *this,KDataStream *stream)

{
  undefined1 *T;
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  KUINT16 KVar3;
  ushort uVar4;
  KException *this_00;
  ushort uVar5;
  KUINT8 tmp;
  KString local_50;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (5 < KVar3) {
    puVar2 = (this->m_vui8DataVals).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    GridData::Decode(&this->super_GridData,stream);
    T = &(this->super_GridData).field_0xc;
    KDataStream::Read<unsigned_short>(stream,(unsigned_short *)T);
    local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffffff00;
    uVar4 = *(ushort *)&(this->super_GridData).field_0xc;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        KDataStream::Read(stream,(KUOCTET *)&local_50);
        __position._M_current =
             (this->m_vui8DataVals).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vui8DataVals,
                     __position,(uchar *)&local_50);
        }
        else {
          *__position._M_current = (uchar)local_50._M_dataplus._M_p;
          ppuVar1 = &(this->m_vui8DataVals).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar5 = uVar5 + 1;
        uVar4 = *(ushort *)T;
      } while (uVar5 < uVar4);
    }
    if ((uVar4 & 1) != 0) {
      KDataStream::Read(stream,&this->m_ui8Padding);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
  KException::KException(this_00,&local_50,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridDataType0::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE0_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui8DataVals.clear();

    GridData::Decode( stream );

    stream >> m_ui16NumBytes;

    KUINT8 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        stream >> tmp;
        m_vui8DataVals.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumBytes % 2 == 1 )
    {
        stream >> m_ui8Padding;
    }
}